

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field_inl.h
# Opt level: O0

void __thiscall
google::protobuf::internal::
TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InitializeIterator
          (TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef> *this,
          MapIterator *map_iter)

{
  void *pvVar1;
  LogMessage *this_00;
  long *in_RSI;
  LogMessage *other;
  LogMessage *in_stack_ffffffffffffff90;
  uint7 in_stack_ffffffffffffffa0;
  byte bVar2;
  LogMessage local_58;
  long *local_10;
  
  local_10 = in_RSI;
  pvVar1 = operator_new(0x18);
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::const_iterator::const_iterator
            ((const_iterator *)0x43f728);
  *local_10 = (long)pvVar1;
  bVar2 = 0;
  if (*local_10 == 0) {
    other = &local_58;
    LogMessage::LogMessage
              ((LogMessage *)(ulong)in_stack_ffffffffffffffa0,
               (LogLevel_conflict)((ulong)pvVar1 >> 0x20),(char *)in_stack_ffffffffffffff90,
               (int)((ulong)other >> 0x20));
    bVar2 = 1;
    this_00 = LogMessage::operator<<(in_stack_ffffffffffffff90,(char *)other);
    LogFinisher::operator=((LogFinisher *)this_00,other);
  }
  if ((bVar2 & 1) != 0) {
    LogMessage::~LogMessage((LogMessage *)0x43f7ad);
  }
  return;
}

Assistant:

void TypeDefinedMapFieldBase<Key, T>::InitializeIterator(
    MapIterator* map_iter) const {
  map_iter->iter_ = new typename Map<Key, T>::const_iterator;
  GOOGLE_CHECK(map_iter->iter_ != NULL);
}